

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VmConstant * CreateConstantLong(Allocator *allocator,SynBase *source,longlong value)

{
  VmType type;
  VmConstant *this;
  VmConstant *result;
  longlong value_local;
  SynBase *source_local;
  Allocator *allocator_local;
  
  this = anon_unknown.dwarf_d4e18::get<VmConstant>(allocator);
  type.structType = VmType::Long.structType;
  type.type = VmType::Long.type;
  type.size = VmType::Long.size;
  VmConstant::VmConstant(this,allocator,type,source);
  this->lValue = value;
  return this;
}

Assistant:

VmConstant* CreateConstantLong(Allocator *allocator, SynBase *source, long long value)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Long, source);

	result->lValue = value;

	return result;
}